

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_init.c
# Opt level: O2

MPP_RET append_interview_list
                  (H264_DpbBuf_t *p_Dpb,RK_S32 currPicStructure,RK_S32 list_idx,
                  H264_FrameStore_t **list,RK_S32 *listXsize,RK_S32 currPOC,RK_S32 curr_layer_id,
                  RK_S32 anchor_pic_flag)

{
  uint uVar1;
  int iVar2;
  H264_FrameStore_t *pHVar3;
  h264_subsps_t *phVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lStack_20;
  
  if (curr_layer_id < 0) {
    if (((byte)h264d_debug & 4) != 0) {
      _mpp_log_l(4,"h264d_init","value error(%d).\n",(char *)0x0,0x3c6);
      return MPP_ERR_VALUE;
    }
    return MPP_ERR_VALUE;
  }
  pHVar3 = *p_Dpb->fs_ilref;
  uVar7 = (ulong)(list_idx != 0) * 0x10;
  phVar4 = p_Dpb->p_Vid->active_subsps;
  uVar8 = uVar7 | 0x1068;
  lVar6 = uVar7 + 0x1060;
  if (anchor_pic_flag != 0) {
    uVar8 = uVar7 + 0x1048;
    lVar6 = uVar7 + 0x1040;
  }
  uVar1 = *(uint *)(*(long *)((long)(phVar4->sps).seq_scaling_list_present_flag + lVar6 + -0x30) +
                   (ulong)(uint)curr_layer_id * 4);
  if (currPicStructure == 1) {
    if ((pHVar3->is_used & 1) == 0) {
      return MPP_OK;
    }
    lVar6 = 200;
    lStack_20 = 0x58;
  }
  else if (currPicStructure == 3) {
    if (pHVar3->is_used != 3) {
      return MPP_OK;
    }
    lVar6 = 0xc4;
    lStack_20 = 0x50;
  }
  else {
    if (currPicStructure != 2) {
      return MPP_OK;
    }
    if ((pHVar3->is_used & 2) == 0) {
      return MPP_OK;
    }
    lVar6 = 0xcc;
    lStack_20 = 0x60;
  }
  lVar5 = *(long *)((long)pHVar3->inter_view_flag + lStack_20 + -0x28);
  lVar11 = 4;
  if (*(char *)(lVar5 + 0xc0) != '\0') {
    lVar11 = lVar6;
  }
  if ((pHVar3->inter_view_flag[currPicStructure == 2] != 0) && (*(int *)(lVar5 + lVar11) == currPOC)
     ) {
    uVar7 = 0;
    if (0 < (int)uVar1) {
      uVar7 = (ulong)uVar1;
    }
    uVar9 = 0xffffffffffffffff;
    do {
      uVar10 = uVar7;
      if (uVar9 - uVar7 == -1) break;
      uVar10 = uVar9 + 1;
      lVar6 = uVar9 * 4;
      uVar9 = uVar10;
    } while (*(int *)(*(long *)(*(long *)((long)(phVar4->sps).seq_scaling_list_present_flag +
                                         (uVar8 - 0x30)) + (ulong)(uint)curr_layer_id * 8) + 4 +
                     lVar6) != pHVar3->view_id);
    if ((long)uVar10 < (long)(int)uVar1) {
      iVar2 = *listXsize;
      list[iVar2] = pHVar3;
      *listXsize = iVar2 + 1;
    }
  }
  return MPP_OK;
}

Assistant:

static MPP_RET append_interview_list(H264_DpbBuf_t *p_Dpb,
                                     RK_S32 currPicStructure, RK_S32 list_idx, H264_FrameStore_t **list,
                                     RK_S32 *listXsize, RK_S32 currPOC, RK_S32 curr_layer_id, RK_S32 anchor_pic_flag)
{
    RK_S32 poc = 0;
    RK_S32 fld_idx = 0;
    RK_U32 pic_avail = 0;
    RK_S32 num_ref_views = 0;
    RK_S32 *ref_view_id = NULL;
    MPP_RET ret = MPP_ERR_UNKNOW;
    RK_S32 iVOIdx = curr_layer_id;
    H264_FrameStore_t *fs = p_Dpb->fs_ilref[0];
    H264dVideoCtx_t *p_Vid = p_Dpb->p_Vid;

    VAL_CHECK(ret, iVOIdx >= 0); //!< Error: iVOIdx: %d is not less than 0
    if (anchor_pic_flag) {
        num_ref_views = list_idx ? p_Vid->active_subsps->num_anchor_refs_l1[iVOIdx] : p_Vid->active_subsps->num_anchor_refs_l0[iVOIdx];
        ref_view_id = list_idx ? p_Vid->active_subsps->anchor_ref_l1[iVOIdx] : p_Vid->active_subsps->anchor_ref_l0[iVOIdx];
    } else {
        num_ref_views = list_idx ? p_Vid->active_subsps->num_non_anchor_refs_l1[iVOIdx] : p_Vid->active_subsps->num_non_anchor_refs_l0[iVOIdx];
        ref_view_id = list_idx ? p_Vid->active_subsps->non_anchor_ref_l1[iVOIdx] : p_Vid->active_subsps->non_anchor_ref_l0[iVOIdx];
    }

    if (currPicStructure == BOTTOM_FIELD)
        fld_idx = 1;
    else
        fld_idx = 0;

    if (currPicStructure == FRAME) {
        pic_avail = (fs->is_used == 3);
        if (pic_avail) {
            poc = fs->frame->is_mmco_5 ? fs->frame->poc_mmco5 : fs->frame->poc;
        }
    } else if (currPicStructure == TOP_FIELD) {
        pic_avail = fs->is_used & 1;
        if (pic_avail) {
            poc = fs->top_field->is_mmco_5 ? fs->top_field->top_poc_mmco5 : fs->top_field->poc;
        }
    } else if (currPicStructure == BOTTOM_FIELD) {
        pic_avail = fs->is_used & 2;
        if (pic_avail) {
            poc = fs->bottom_field->is_mmco_5 ? fs->bottom_field->bot_poc_mmco5 : fs->bottom_field->poc;
        }
    } else {
        pic_avail = 0;
    }

    if (pic_avail && fs->inter_view_flag[fld_idx]) {
        if (poc == currPOC) {
            if (is_view_id_in_ref_view_list(fs->view_id, ref_view_id, num_ref_views)) {
                //!< add one inter-view reference;
                list[*listXsize] = fs;
                //!< next;
                (*listXsize)++;
            }
        }
    }
    return ret = MPP_OK;
__FAILED:
    return ret;
}